

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmFunctionAccess(ExpressionContext *ctx,VmModule *module,ExprFunctionAccess *node)

{
  SynBase *source;
  VmConstant *el0;
  VmValue *pVVar1;
  VmType type;
  VmValue *in_stack_ffffffffffffffd0;
  
  if (node->function->vmFunction != (VmFunction *)0x0) {
    if (node->context == (ExprBase *)0x0) {
      el0 = CreateConstantPointer
                      (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                       ctx->typeNullPtr,false);
    }
    else {
      el0 = (VmConstant *)CompileVm(ctx,module,node->context);
    }
    source = (node->super_ExprBase).source;
    type = VmType::FunctionRef(&node->function->type->super_TypeBase);
    pVVar1 = anon_unknown.dwarf_11cad6::CreateConstruct
                       (module,source,type,&el0->super_VmValue,
                        &node->function->vmFunction->super_VmValue,(VmValue *)0x0,
                        in_stack_ffffffffffffffd0);
    pVVar1 = anon_unknown.dwarf_11cad6::CheckType(ctx,&node->super_ExprBase,pVVar1);
    return pVVar1;
  }
  __assert_fail("node->function->vmFunction",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xe70,
                "VmValue *CompileVmFunctionAccess(ExpressionContext &, VmModule *, ExprFunctionAccess *)"
               );
}

Assistant:

VmValue* CompileVmFunctionAccess(ExpressionContext &ctx, VmModule *module, ExprFunctionAccess *node)
{
	assert(node->function->vmFunction);

	VmValue *context = node->context ? CompileVm(ctx, module, node->context) : CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false);

	VmValue *funcRef = CreateConstruct(module, node->source, VmType::FunctionRef(node->function->type), context, node->function->vmFunction, NULL, NULL);

	return CheckType(ctx, node, funcRef);
}